

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

value class_metadata_methods_impl(char *name,size_t size,map methods)

{
  value v;
  value *ppvVar1;
  value pvVar2;
  size_t size_00;
  class_metadata_iterator_args_type iterator;
  
  v = value_create_array((value *)0x0,2);
  if (v != (value)0x0) {
    ppvVar1 = value_to_array(v);
    pvVar2 = value_create_string(name,size - 1);
    *ppvVar1 = pvVar2;
    if (pvVar2 != (value)0x0) {
      size_00 = map_size();
      pvVar2 = value_create_array((value *)0x0,size_00);
      ppvVar1[1] = pvVar2;
      if (pvVar2 != (value)0x0) {
        map_iterate(methods,class_metadata_methods_impl_cb_iterate);
        return v;
      }
    }
    value_type_destroy(v);
  }
  return (value)0x0;
}

Assistant:

value class_metadata_methods_impl(const char name[], size_t size, map methods)
{
	value v = value_create_array(NULL, 2);
	value *v_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(name, size - 1);

	if (v_array[0] == NULL)
	{
		goto error_value;
	}

	v_array[1] = value_create_array(NULL, map_size(methods));

	if (v_array[1] == NULL)
	{
		goto error_value;
	}

	struct class_metadata_iterator_args_type iterator;

	iterator.v = v_array[1];
	iterator.count = 0;

	map_iterate(methods, &class_metadata_methods_impl_cb_iterate, &iterator);

	return v;
error_value:
	value_type_destroy(v);
	return NULL;
}